

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Requirement.cpp
# Opt level: O1

void __thiscall
Requirement::Requirement(Requirement *this,string *shiftType,string *skill,json *daysRequirements)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer *ppDVar3;
  iterator __position;
  Scenario *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  const_reference other;
  reference pvVar4;
  ulong uVar5;
  long lVar6;
  int ret;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  DaysOfTheWeekVector;
  string requirementTxt;
  json j;
  int local_cc;
  string *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  int local_b0;
  int local_ac;
  vector<DayRequirement,_std::allocator<DayRequirement>_> *local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  json *local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_40;
  
  paVar1 = &(this->shiftType).field_2;
  (this->shiftType)._M_dataplus._M_p = (pointer)paVar1;
  (this->shiftType)._M_string_length = 0;
  (this->shiftType).field_2._M_local_buf[0] = '\0';
  paVar2 = &(this->skill).field_2;
  (this->skill)._M_dataplus._M_p = (pointer)paVar2;
  (this->skill)._M_string_length = 0;
  (this->skill).field_2._M_local_buf[0] = '\0';
  local_a8 = &this->days;
  (this->days).super__Vector_base<DayRequirement,_std::allocator<DayRequirement>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->days).super__Vector_base<DayRequirement,_std::allocator<DayRequirement>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->days).super__Vector_base<DayRequirement,_std::allocator<DayRequirement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_68 = daysRequirements;
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::_M_assign((string *)&this->skill);
  this_00 = Scenario::getInstance();
  __x = Scenario::getDaysOfTheWeekVector_abi_cxx11_(this_00);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_a0,__x);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  local_c8 = &this->skill;
  local_c0 = paVar2;
  local_b8 = paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"requirementOn","");
  if (local_a0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_a0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar6 = 0;
    uVar5 = 0;
    do {
      std::operator+(&local_60,&local_88,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&((local_a0.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar6
                     ));
      other = nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator[](local_68,&local_60);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::basic_json(&local_40,other);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      pvVar4 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)&local_40,"minimum");
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
                (pvVar4,&local_cc);
      local_ac = local_cc;
      pvVar4 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)&local_40,"optimal");
      nlohmann::detail::
      from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
                (pvVar4,&local_cc);
      local_b0 = local_cc;
      DayRequirement::DayRequirement((DayRequirement *)&local_60,&local_ac,&local_b0);
      __position._M_current =
           (this->days).super__Vector_base<DayRequirement,_std::allocator<DayRequirement>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->days).super__Vector_base<DayRequirement,_std::allocator<DayRequirement>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<DayRequirement,_std::allocator<DayRequirement>_>::
        _M_realloc_insert<DayRequirement>(local_a8,__position,(DayRequirement *)&local_60);
      }
      else {
        *__position._M_current = (DayRequirement)local_60._M_dataplus._M_p;
        ppDVar3 = &(this->days).super__Vector_base<DayRequirement,_std::allocator<DayRequirement>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppDVar3 = *ppDVar3 + 1;
      }
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(&local_40);
      uVar5 = uVar5 + 1;
      lVar6 = lVar6 + 0x20;
    } while (uVar5 < (ulong)((long)local_a0.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_a0.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a0);
  return;
}

Assistant:

Requirement::Requirement(string shiftType, string skill, const json &daysRequirements) {
    this->shiftType = shiftType;
    this->skill = skill;

    const vector<string> DaysOfTheWeekVector = Scenario::getInstance()->getDaysOfTheWeekVector();

    string requirementTxt = "requirementOn";

    for (int i = 0; i < DaysOfTheWeekVector.size(); i++) {
        json j = daysRequirements[requirementTxt + DaysOfTheWeekVector.at(i)];
        days.push_back(DayRequirement(
                j["minimum"].get<int>(),
                j["optimal"].get<int>()));
    }
}